

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall
Internal_FakeWindowsLogfontName::Internal_FakeWindowsLogfontName
          (Internal_FakeWindowsLogfontName *this,wchar_t *family_name,wchar_t *postscript_name,
          wchar_t *fake_logfont_name,Member quartet_member)

{
  ON_wString *this_00;
  undefined8 uVar1;
  bool bVar2;
  
  NameHash(&this->m_family_and_postcript_name_hash,family_name,postscript_name);
  this_00 = &this->m_fake_logfont_name;
  ON_wString::ON_wString(this_00,fake_logfont_name);
  this->m_quartet_member = quartet_member;
  ON_wString::TrimLeftAndRight(this_00,(wchar_t *)0x0);
  bVar2 = ON_wString::EqualOrdinal(this_00,family_name,true);
  if ((!bVar2) &&
     (((quartet_member == Unset || (bVar2 = ON_wString::IsEmpty(this_00), !bVar2)) &&
      (bVar2 = ON_SHA1_Hash::IsZeroDigestOrEmptyContentHash(&this->m_family_and_postcript_name_hash)
      , !bVar2)))) {
    return;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
             ,0x1d45,"","Invalid input.");
  ON_wString::operator=(this_00,&ON_wString::EmptyString);
  *(undefined4 *)((this->m_family_and_postcript_name_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_family_and_postcript_name_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_family_and_postcript_name_hash).m_digest + 8) = uVar1;
  this->m_quartet_member = Unset;
  return;
}

Assistant:

Internal_FakeWindowsLogfontName(
    const wchar_t* family_name,
    const wchar_t* postscript_name,
    const wchar_t* fake_logfont_name,
    ON_FontFaceQuartet::Member quartet_member
  )
  : m_fake_logfont_name(fake_logfont_name)
  , m_family_and_postcript_name_hash(Internal_FakeWindowsLogfontName::NameHash(family_name, postscript_name))
  , m_quartet_member(quartet_member)
  // for debugging
  //, m_family_name(family_name)
  //, m_postscript_name(postscript_name)
  {
    m_fake_logfont_name.TrimLeftAndRight();
    if (
      m_fake_logfont_name.EqualOrdinal(family_name, true)
      || (ON_FontFaceQuartet::Member::Unset != quartet_member && m_fake_logfont_name.IsEmpty())
      || m_family_and_postcript_name_hash.IsZeroDigestOrEmptyContentHash()
      )
    {
      ON_ERROR("Invalid input.");
      m_fake_logfont_name = ON_wString::EmptyString;
      m_family_and_postcript_name_hash = ON_SHA1_Hash::EmptyContentHash;
      m_quartet_member = ON_FontFaceQuartet::Member::Unset;
    }
  }